

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O1

void set_mode_eval_params(AV1_COMP *cpi,MACROBLOCK *x,MODE_EVAL_TYPE mode_eval_type)

{
  MB_RD_RECORD *pMVar1;
  ulong uVar2;
  TX_MODE TVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined3 in_register_00000011;
  int iVar7;
  bool bVar8;
  
  iVar7 = CONCAT31(in_register_00000011,mode_eval_type);
  (x->txfm_search_params).use_qm_dist_metric =
       (uint)((cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR);
  if (iVar7 == 2) {
    (x->txfm_search_params).use_default_intra_tx_type = 0;
    (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
    (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[2];
    (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[2];
    if ((x->txfm_search_params).use_qm_dist_metric == 0) {
      if ((cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist == 0) {
        (x->txfm_search_params).use_transform_domain_distortion =
             (cpi->winner_mode_params).use_transform_domain_distortion[0];
        uVar4 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
      }
      else {
        (x->txfm_search_params).use_transform_domain_distortion =
             (cpi->winner_mode_params).use_transform_domain_distortion[2];
        uVar4 = (cpi->winner_mode_params).tx_domain_dist_threshold[2];
      }
      (x->txfm_search_params).tx_domain_dist_threshold = uVar4;
    }
    else {
      (x->txfm_search_params).use_transform_domain_distortion = 1;
      (x->txfm_search_params).tx_domain_dist_threshold = 0;
    }
    uVar2 = (ulong)((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0);
    (x->txfm_search_params).coeff_opt_thresholds[0] =
         (cpi->winner_mode_params).coeff_opt_thresholds[uVar2 * 2][0];
    (x->txfm_search_params).coeff_opt_thresholds[1] =
         (cpi->winner_mode_params).coeff_opt_thresholds[uVar2 * 2][1];
    iVar5 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
    (x->txfm_search_params).tx_size_search_method =
         (cpi->winner_mode_params).tx_size_search_methods[0];
    if (iVar5 != 0) {
      (x->txfm_search_params).tx_size_search_method =
           (cpi->winner_mode_params).tx_size_search_methods[2];
    }
    TVar3 = '\0';
    if ((cpi->common).features.coded_lossless == false) {
      TVar3 = '\x02' - ((x->txfm_search_params).tx_size_search_method == '\x02');
    }
    (x->txfm_search_params).tx_mode_search_type = TVar3;
    lVar6 = (long)(cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
    (x->txfm_search_params).prune_2d_txfm_mode =
         (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
    if (lVar6 == 0) goto LAB_0025a223;
    iVar5 = *(int *)(&DAT_0050b2ec + lVar6 * 8);
  }
  else {
    uVar4 = 1;
    if ((cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search == 0) {
      uVar4 = (uint)(cpi->oxcf).txfm_cfg.use_intra_default_tx_only;
    }
    (x->txfm_search_params).use_default_intra_tx_type = uVar4;
    (x->txfm_search_params).default_inter_tx_type_prob_thresh =
         (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh;
    (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[1];
    (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[1];
    if ((x->txfm_search_params).use_qm_dist_metric == 0) {
      if ((cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist == 0) {
        (x->txfm_search_params).use_transform_domain_distortion =
             (cpi->winner_mode_params).use_transform_domain_distortion[0];
        uVar4 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
      }
      else {
        (x->txfm_search_params).use_transform_domain_distortion =
             (cpi->winner_mode_params).use_transform_domain_distortion[1];
        uVar4 = (cpi->winner_mode_params).tx_domain_dist_threshold[1];
      }
      (x->txfm_search_params).tx_domain_dist_threshold = uVar4;
    }
    else {
      (x->txfm_search_params).use_transform_domain_distortion = 1;
      (x->txfm_search_params).tx_domain_dist_threshold = 0;
    }
    bVar8 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0;
    (x->txfm_search_params).coeff_opt_thresholds[0] =
         (cpi->winner_mode_params).coeff_opt_thresholds[bVar8][0];
    (x->txfm_search_params).coeff_opt_thresholds[1] =
         (cpi->winner_mode_params).coeff_opt_thresholds[bVar8][1];
    iVar5 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
    (x->txfm_search_params).tx_size_search_method =
         (cpi->winner_mode_params).tx_size_search_methods[0];
    if (iVar5 != 0) {
      (x->txfm_search_params).tx_size_search_method =
           (cpi->winner_mode_params).tx_size_search_methods[1];
    }
    TVar3 = '\0';
    if ((cpi->common).features.coded_lossless == false) {
      TVar3 = '\x02' - ((x->txfm_search_params).tx_size_search_method == '\x02');
    }
    (x->txfm_search_params).tx_mode_search_type = TVar3;
    lVar6 = (long)(cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
    (x->txfm_search_params).prune_2d_txfm_mode =
         (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
    if (lVar6 == 0) goto LAB_0025a223;
    iVar5 = *(int *)(&DAT_0050b2e8 + lVar6 * 8);
  }
  (x->txfm_search_params).prune_2d_txfm_mode = iVar5;
LAB_0025a223:
  if (((x->txfm_search_params).mode_eval_type != iVar7) &&
     (pMVar1 = (x->txfm_search_info).mb_rd_record, pMVar1 != (MB_RD_RECORD *)0x0)) {
    pMVar1->index_start = 0;
    pMVar1->num = 0;
  }
  (x->txfm_search_params).mode_eval_type = iVar7;
  return;
}

Assistant:

static inline void set_mode_eval_params(const struct AV1_COMP *cpi,
                                        MACROBLOCK *x,
                                        MODE_EVAL_TYPE mode_eval_type) {
  const AV1_COMMON *cm = &cpi->common;
  const SPEED_FEATURES *sf = &cpi->sf;
  const WinnerModeParams *winner_mode_params = &cpi->winner_mode_params;
  TxfmSearchParams *txfm_params = &x->txfm_search_params;

  txfm_params->use_qm_dist_metric =
      cpi->oxcf.tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;

  switch (mode_eval_type) {
    case DEFAULT_EVAL:
      txfm_params->default_inter_tx_type_prob_thresh = INT_MAX;
      txfm_params->use_default_intra_tx_type = 0;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[DEFAULT_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[DEFAULT_EVAL];
      // Set default transform domain distortion type
      set_tx_domain_dist_params(winner_mode_params, txfm_params, 0, 0);

      // Get default threshold for R-D optimization of coefficients
      get_rd_opt_coeff_thresh(winner_mode_params->coeff_opt_thresholds,
                              txfm_params, 0, 0);

      // Set default transform size search method
      set_tx_size_search_method(cm, winner_mode_params, txfm_params, 0, 0);
      // Set default transform type prune
      set_tx_type_prune(sf, txfm_params, 0, 0);
      break;
    case MODE_EVAL:
      txfm_params->use_default_intra_tx_type =
          (cpi->sf.tx_sf.tx_type_search.fast_intra_tx_type_search ||
           cpi->oxcf.txfm_cfg.use_intra_default_tx_only);
      txfm_params->default_inter_tx_type_prob_thresh =
          cpi->sf.tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[MODE_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[MODE_EVAL];
      // Set transform domain distortion type for mode evaluation
      set_tx_domain_dist_params(
          winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist, 0);

      // Get threshold for R-D optimization of coefficients during mode
      // evaluation
      get_rd_opt_coeff_thresh(
          winner_mode_params->coeff_opt_thresholds, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_coeff_opt, 0);

      // Set the transform size search method for mode evaluation
      set_tx_size_search_method(
          cm, winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch, 0);
      // Set transform type prune for mode evaluation
      set_tx_type_prune(sf, txfm_params,
                        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning,
                        0);
      break;
    case WINNER_MODE_EVAL:
      txfm_params->default_inter_tx_type_prob_thresh = INT_MAX;
      txfm_params->use_default_intra_tx_type = 0;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[WINNER_MODE_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[WINNER_MODE_EVAL];

      // Set transform domain distortion type for winner mode evaluation
      set_tx_domain_dist_params(
          winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist, 1);

      // Get threshold for R-D optimization of coefficients for winner mode
      // evaluation
      get_rd_opt_coeff_thresh(
          winner_mode_params->coeff_opt_thresholds, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_coeff_opt, 1);

      // Set the transform size search method for winner mode evaluation
      set_tx_size_search_method(
          cm, winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch, 1);
      // Set default transform type prune mode for winner mode evaluation
      set_tx_type_prune(sf, txfm_params,
                        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning,
                        1);
      break;
    default: assert(0);
  }

  // Rd record collected at a specific mode evaluation stage can not be used
  // across other evaluation stages as the transform parameters are different.
  // Hence, reset mb rd record whenever mode evaluation stage type changes.
  if (txfm_params->mode_eval_type != mode_eval_type)
    reset_mb_rd_record(x->txfm_search_info.mb_rd_record);

  txfm_params->mode_eval_type = mode_eval_type;
}